

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

void setup_frame_size(AV1_COMMON *cm,int frame_size_override_flag,aom_read_bit_buffer *rb)

{
  int in_ESI;
  long in_RDI;
  int num_bits_height;
  int num_bits_width;
  int height;
  int width;
  SequenceHeader *seq_params;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  uint in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  uint in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  AV1_COMMON *cm_00;
  
  cm_00 = *(AV1_COMMON **)(in_RDI + 0x6088);
  if (in_ESI == 0) {
    in_stack_ffffffffffffffdc = (cm_00->current_frame).display_order_hint;
    in_stack_ffffffffffffffd8 = (cm_00->current_frame).pyramid_level;
  }
  else {
    in_stack_ffffffffffffffd4._0_1_ = (cm_00->current_frame).frame_type;
    in_stack_ffffffffffffffd4._1_1_ = (cm_00->current_frame).reference_mode;
    in_stack_ffffffffffffffd4._2_2_ = *(undefined2 *)&(cm_00->current_frame).field_0x2;
    in_stack_ffffffffffffffd0 = (cm_00->current_frame).order_hint;
    read_frame_size((aom_read_bit_buffer *)cm_00,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8
                    ,(int *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                    (int *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    if (((int)(cm_00->current_frame).display_order_hint < in_stack_ffffffffffffffdc) ||
       ((int)(cm_00->current_frame).pyramid_level < (int)in_stack_ffffffffffffffd8)) {
      aom_internal_error(*(aom_internal_error_info **)(in_RDI + 0x30),AOM_CODEC_CORRUPT_FRAME,
                         "Frame dimensions are larger than the maximum values");
    }
  }
  setup_superres(cm_00,(aom_read_bit_buffer *)
                       CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                 (int *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 (int *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  resize_context_buffers
            ((AV1_COMMON *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
  setup_render_size((AV1_COMMON *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                    (aom_read_bit_buffer *)
                    CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  setup_buffer_pool(_height);
  return;
}

Assistant:

static inline void setup_frame_size(AV1_COMMON *cm,
                                    int frame_size_override_flag,
                                    struct aom_read_bit_buffer *rb) {
  const SequenceHeader *const seq_params = cm->seq_params;
  int width, height;

  if (frame_size_override_flag) {
    int num_bits_width = seq_params->num_bits_width;
    int num_bits_height = seq_params->num_bits_height;
    read_frame_size(rb, num_bits_width, num_bits_height, &width, &height);
    if (width > seq_params->max_frame_width ||
        height > seq_params->max_frame_height) {
      aom_internal_error(cm->error, AOM_CODEC_CORRUPT_FRAME,
                         "Frame dimensions are larger than the maximum values");
    }
  } else {
    width = seq_params->max_frame_width;
    height = seq_params->max_frame_height;
  }

  setup_superres(cm, rb, &width, &height);
  resize_context_buffers(cm, width, height);
  setup_render_size(cm, rb);
  setup_buffer_pool(cm);
}